

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O0

int genaNotifyAll(UpnpDevice_Handle device_handle,char *UDN,char *servId,char **VarNames,
                 char **VarValues,int var_count)

{
  char *local_48;
  char *propertySet;
  uint local_38;
  int line;
  int ret;
  int var_count_local;
  char **VarValues_local;
  char **VarNames_local;
  char *servId_local;
  char *UDN_local;
  UpnpDevice_Handle device_handle_local;
  
  local_38 = 0;
  propertySet._4_4_ = 0;
  local_48 = (char *)0x0;
  line = var_count;
  _ret = VarValues;
  VarValues_local = VarNames;
  VarNames_local = (char **)servId;
  servId_local = UDN;
  UDN_local._4_4_ = device_handle;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x3f9,"GENA BEGIN NOTIFY ALL\n");
  local_38 = GeneratePropertySet(VarValues_local,_ret,line,&local_48);
  if (local_38 == 0) {
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x403,
               "GENERATED PROPERTY SET IN EXT NOTIFY: %s\n",local_48);
    local_38 = genaNotifyAllCommon(UDN_local._4_4_,servId_local,(char *)VarNames_local,local_48);
  }
  else {
    propertySet._4_4_ = 0x3fd;
  }
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",propertySet._4_4_,
             "GENA END NOTIFY ALL, ret = %d\n",(ulong)local_38);
  return local_38;
}

Assistant:

int genaNotifyAll(UpnpDevice_Handle device_handle,
	char *UDN,
	char *servId,
	char **VarNames,
	char **VarValues,
	int var_count)
{
	int ret = GENA_SUCCESS;
	int line = 0;

	DOMString propertySet = NULL;

	UpnpPrintf(
		UPNP_INFO, GENA, __FILE__, __LINE__, "GENA BEGIN NOTIFY ALL\n");

	ret = GeneratePropertySet(VarNames, VarValues, var_count, &propertySet);
	if (ret != XML_SUCCESS) {
		line = __LINE__;
		goto ExitFunction;
	}
	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENERATED PROPERTY SET IN EXT NOTIFY: %s\n",
		propertySet);

	ret = genaNotifyAllCommon(device_handle, UDN, servId, propertySet);

ExitFunction:

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		line,
		"GENA END NOTIFY ALL, ret = %d\n",
		ret);

	return ret;
}